

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdatasrc.h
# Opt level: O3

void __thiscall CVmMemorySourceList::add_block(CVmMemorySourceList *this)

{
  CVmMemorySourceBlock *pCVar1;
  long lVar2;
  CVmMemorySourceBlock *pCVar3;
  
  pCVar1 = this->last_block_;
  if (pCVar1 == (CVmMemorySourceBlock *)0x0) {
    pCVar3 = (CVmMemorySourceBlock *)operator_new(0x1010);
    pCVar3->nxt = (CVmMemorySourceBlock *)0x0;
    pCVar3->ofs = 0;
    this->first_block_ = pCVar3;
  }
  else {
    lVar2 = pCVar1->ofs;
    pCVar3 = (CVmMemorySourceBlock *)operator_new(0x1010);
    pCVar3->ofs = lVar2 + 0x1000;
    pCVar3->nxt = (CVmMemorySourceBlock *)0x0;
    pCVar1->nxt = pCVar3;
  }
  this->last_block_ = pCVar3;
  return;
}

Assistant:

void add_block()
    {
        long ofs = last_block_ == 0 ? 0 : last_block_->ofs + BlockLen;
        CVmMemorySourceBlock *b = new CVmMemorySourceBlock(ofs);

        if (last_block_ != 0)
            last_block_->nxt = b;
        else
            first_block_ = b;
        last_block_ = b;
    }